

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
anurbs::RTree<2l>::search<anurbs::RTree<2l>::PickByRay>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,void *this,PickByRay *check,
          Callback *callback)

{
  double *pdVar1;
  bool bVar2;
  runtime_error *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lStack_c0;
  Index index;
  Callback *local_a0;
  _Vector_base<long,_std::allocator<long>_> local_98;
  long local_78;
  long local_70;
  Vector local_68;
  Vector local_58;
  Vector node_max;
  
  lVar3 = *(long *)((long)this + 0x50);
  local_a0 = callback;
  if (lVar3 != *(long *)((long)this + 0x60) - *(long *)((long)this + 0x58) >> 3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Data not yet indexed - call RTree::finish().");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lStack_c0 = (*(long *)((long)this + 0x18) - *(long *)((long)this + 0x10) >> 3) + -1;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = lVar3 + -1;
  do {
    if (lVar3 < 0) {
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_98);
      return __return_storage_ptr__;
    }
    lVar6 = *(long *)((long)this + 8) + lVar3;
    lVar4 = *(long *)(*(long *)((long)this + 0x10) + lStack_c0 * 8);
    if (lVar4 < lVar6) {
      lVar6 = lVar4;
    }
    local_78 = lStack_c0 + -1;
    lVar5 = lVar3 << 4;
    for (lVar4 = lVar3; lVar4 < lVar6; lVar4 = lVar4 + 1) {
      index = *(Index *)(*(long *)((long)this + 0x58) + lVar4 * 8);
      pdVar1 = (double *)(*(long *)((long)this + 0x88) + lVar5);
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
      [0] = *pdVar1;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
      [1] = pdVar1[1];
      pdVar1 = (double *)(*(long *)((long)this + 0x70) + lVar5);
      local_58.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
      [0] = *pdVar1;
      local_58.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
      [1] = pdVar1[1];
      node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
      [0] = local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
            array[0];
      node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
      [1] = local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
            array[1];
      bVar2 = RTree<2L>::PickByRay::operator()(check,&local_58,&local_68);
      if (bVar2) {
        if (lVar3 < *this) {
          if ((local_a0->super__Function_base)._M_manager != (_Manager_type)0x0) {
            bVar2 = std::function<bool_(long)>::operator()(local_a0,index);
            if (!bVar2) goto LAB_001c7e49;
          }
          std::vector<long,_std::allocator<long>_>::push_back(__return_storage_ptr__,&index);
        }
        else {
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)&local_98,&index);
          local_70 = local_78;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)&local_98,&local_70);
        }
      }
LAB_001c7e49:
      lVar5 = lVar5 + 0x10;
    }
    lStack_c0 = -1;
    lVar3 = lStack_c0;
    if (local_98._M_impl.super__Vector_impl_data._M_start !=
        local_98._M_impl.super__Vector_impl_data._M_finish) {
      lVar3 = local_98._M_impl.super__Vector_impl_data._M_finish[-2];
      lStack_c0 = local_98._M_impl.super__Vector_impl_data._M_finish[-1];
      local_98._M_impl.super__Vector_impl_data._M_finish =
           local_98._M_impl.super__Vector_impl_data._M_finish + -2;
    }
  } while( true );
}

Assistant:

std::vector<Index> search(const TCheck& check, Callback callback)
    {
        if (m_position != length(m_indices)) {
            throw std::runtime_error("Data not yet indexed - call RTree::finish().");
        }

        Index node_index = length(m_indices) - 1;
        Index level = length(m_level_bounds) - 1;
        std::vector<Index> queue;
        std::vector<Index> results;

        while (node_index > -1) {
            const Index end = std::min<Index>(node_index + m_node_size, m_level_bounds[level]);

            for (Index pos = node_index; pos < end; pos++) {
                const Index index = m_indices[pos];

                const Vector node_min = m_boxes_min[pos];
                const Vector node_max = m_boxes_max[pos];

                if (!check(node_min, node_max)) {
                    continue;
                }

                if (node_index < m_nb_items) {
                    if (callback == nullptr || callback(index)) {
                        results.push_back(index);
                    }
                } else {
                    queue.push_back(index);
                    queue.push_back(level - 1);
                }
            }

            if (queue.empty()) {
                node_index = -1;
                level = -1;
            } else {
                level = queue.back();
                queue.pop_back();
                node_index = queue.back();
                queue.pop_back();
            }
        }

        return results;
    }